

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_job.h
# Opt level: O2

void __thiscall
r_exec::MonitoringJob<r_exec::SRMonitor>::report(MonitoringJob<r_exec::SRMonitor> *this,int64_t lag)

{
  DebugStream *pDVar1;
  undefined1 local_32 [2];
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"monitoring job",(allocator *)(local_32 + 1));
  ::debug((string *)local_32);
  pDVar1 = DebugStream::operator<<((DebugStream *)local_32,"late:");
  pDVar1 = DebugStream::operator<<(pDVar1,lag);
  DebugStream::operator<<(pDVar1,"us behind.");
  DebugStream::~DebugStream((DebugStream *)local_32);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void report(int64_t lag) const
    {
        debug("monitoring job") << "late:" << lag << "us behind.";
    }